

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O2

void test_locked_semaphore_getting_unlocked(void)

{
  thread thread;
  long *local_c8;
  pthread_mutex_t lock;
  pthread_cond_t cond;
  LockstepScheduler ls;
  
  pthread_cond_init((pthread_cond_t *)&cond,(pthread_condattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&lock,(pthread_mutexattr_t *)0x0);
  ls.timed_waits_mutex_.super___mutex_base._M_mutex.__size[0x20] = '\0';
  ls._65_8_ = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex._16_8_ = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex.__size[0x18] = '\0';
  ls.timed_waits_mutex_.super___mutex_base._M_mutex._25_7_ = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex.__align = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex._8_8_ = 0;
  ls.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ls.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ls.time_us_.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  ls.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  LockstepScheduler::set_absolute_time(&ls,0xbc614e);
  pthread_mutex_lock((pthread_mutex_t *)&lock);
  thread._M_id._M_thread = (id)0;
  local_c8 = (long *)operator_new(0x20);
  *local_c8 = (long)&PTR___State_0010cca0;
  local_c8[1] = (long)&ls;
  local_c8[2] = (long)&cond;
  local_c8[3] = (long)&lock;
  std::thread::_M_start_thread(&thread,&local_c8,0);
  if (local_c8 != (long *)0x0) {
    (**(code **)(*local_c8 + 8))();
  }
  pthread_mutex_lock((pthread_mutex_t *)&lock);
  pthread_cond_broadcast((pthread_cond_t *)&cond);
  pthread_mutex_unlock((pthread_mutex_t *)&lock);
  std::thread::join();
  pthread_mutex_destroy((pthread_mutex_t *)&lock);
  pthread_cond_destroy((pthread_cond_t *)&cond);
  std::thread::~thread(&thread);
  std::
  vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ::~vector(&ls.timed_waits_);
  return;
}

Assistant:

void test_locked_semaphore_getting_unlocked()
{
    // Create locked condition.
    pthread_cond_t cond;
    pthread_cond_init(&cond, NULL);

    // And a lock which needs to be locked
    pthread_mutex_t lock;
    pthread_mutex_init(&lock, NULL);

    LockstepScheduler ls;
    ls.set_absolute_time(some_time_us);

    pthread_mutex_lock(&lock);
    // Use a thread to wait for condition while we already have the lock.
    // This ensures the synchronization happens in the right order.
    std::thread thread([&ls, &cond, &lock]() {

        ls.set_absolute_time(some_time_us + 500);
        assert(ls.cond_timedwait(&cond, &lock, some_time_us + 1000) == 0);
        // It should be re-locked afterwards, so we should be able to unlock it.
        assert(pthread_mutex_unlock(&lock) == 0);
    });

    pthread_mutex_lock(&lock);
    pthread_cond_broadcast(&cond);
    pthread_mutex_unlock(&lock);

    thread.join();

    pthread_mutex_destroy(&lock);
    pthread_cond_destroy(&cond);
}